

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs)

{
  pointer pcVar1;
  bool bVar2;
  cmListFileContext *pcVar3;
  pointer __x;
  cmListFileArgument *i;
  pointer pcVar4;
  string_view arg;
  string value;
  
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&value,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&this->Backtrace);
  pcVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&value._M_string_length);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,((long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inArgs->
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pcVar4 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar4 == pcVar1) {
      bVar2 = cmSystemTools::GetFatalErrorOccurred();
      std::__cxx11::string::~string((string *)&value);
      return !bVar2;
    }
    __x = pcVar4;
    if (pcVar4->Delim == Bracket) {
LAB_0018cd33:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&__x->Value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString
                (this,&value,false,false,false,(pcVar3->FilePath)._M_dataplus._M_p,pcVar4->Line,
                 false,false);
      __x = (pointer)&value;
      if (pcVar4->Delim == Quoted) goto LAB_0018cd33;
      arg._M_str = value._M_dataplus._M_p;
      arg._M_len = value._M_string_length;
      cmExpandList(arg,outArgs,false);
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::ExpandArguments(std::vector<cmListFileArgument> const& inArgs,
                                 std::vector<std::string>& outArgs) const
{
  std::string const& filename = this->GetBacktrace().Top().FilePath;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(i.Value);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename.c_str(),
                                  i.Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(value);
    } else {
      cmExpandList(value, outArgs);
    }
  }
  return !cmSystemTools::GetFatalErrorOccurred();
}